

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

int __thiscall deci::ast_postfix_t::Generate(ast_postfix_t *this,ostream *output,int pc)

{
  int iVar1;
  ostream *poVar2;
  
  if (this->arglist == (ast_arg_list_t *)0x0) {
    poVar2 = std::operator<<(output,"call ");
    poVar2 = std::operator<<(poVar2,(string *)&this->identifier);
    poVar2 = std::operator<<(poVar2,"\nresl");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = pc + 2;
  }
  else {
    iVar1 = ast_arg_list_t::Generate(this->arglist,output,pc);
    poVar2 = std::operator<<(output,"call ");
    poVar2 = std::operator<<(poVar2,(string *)&this->identifier);
    poVar2 = std::operator<<(poVar2,"\ndrop ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"\nresl");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = iVar1 + 3;
  }
  return iVar1;
}

Assistant:

int ast_postfix_t::Generate(std::ostream& output, int pc) const {
    if (arglist == nullptr) {
      output << "call " << this->identifier << "\nresl" << std::endl;
      return pc + 2;
    }
    else
    {
      pc = arglist->Generate(output, pc);
      output << "call " << this->identifier << "\ndrop " << arglist->Total() << "\nresl" << std::endl;
      return pc + 3;
    }
  }